

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O0

_Bool TIFFHashSetRehash(TIFFHashSet *set)

{
  int iVar1;
  unsigned_long uVar2;
  TIFFList **ppTVar3;
  unsigned_long uVar4;
  TIFFList *psNext;
  unsigned_long nNewHashVal;
  TIFFList *cur;
  int i;
  TIFFList **newTabList;
  int nNewAllocatedSize;
  TIFFHashSet *set_local;
  
  iVar1 = anPrimes[set->nIndiceAllocatedSize];
  ppTVar3 = (TIFFList **)calloc(8,(long)iVar1);
  if (ppTVar3 == (TIFFList **)0x0) {
    set_local._7_1_ = false;
  }
  else {
    for (cur._4_4_ = 0; cur._4_4_ < set->nAllocatedSize; cur._4_4_ = cur._4_4_ + 1) {
      nNewHashVal = (unsigned_long)set->tabList[cur._4_4_];
      while (nNewHashVal != 0) {
        uVar4 = (*set->fnHashFunc)(*(void **)nNewHashVal);
        uVar2 = *(unsigned_long *)(nNewHashVal + 8);
        *(TIFFList **)(nNewHashVal + 8) = ppTVar3[uVar4 % (ulong)(long)iVar1];
        ppTVar3[uVar4 % (ulong)(long)iVar1] = (TIFFList *)nNewHashVal;
        nNewHashVal = uVar2;
      }
    }
    free(set->tabList);
    set->tabList = ppTVar3;
    set->nAllocatedSize = iVar1;
    set->bRehash = false;
    set_local._7_1_ = true;
  }
  return set_local._7_1_;
}

Assistant:

static bool TIFFHashSetRehash(TIFFHashSet *set)
{
    int nNewAllocatedSize = anPrimes[set->nIndiceAllocatedSize];
    TIFFList **newTabList =
        (TIFFList **)(calloc(sizeof(TIFFList *), nNewAllocatedSize));
    if (newTabList == NULL)
        return false;
#ifdef HASH_DEBUG
    TIFFDebug("TIFFHASH",
              "hashSet=%p, nSize=%d, nCollisions=%d, "
              "fCollisionRate=%.02f",
              set, set->nSize, set->nCollisions,
              set->nCollisions * 100.0 / set->nSize);
    set->nCollisions = 0;
#endif
    for (int i = 0; i < set->nAllocatedSize; i++)
    {
        TIFFList *cur = set->tabList[i];
        while (cur)
        {
            const unsigned long nNewHashVal =
                set->fnHashFunc(cur->pData) % nNewAllocatedSize;
#ifdef HASH_DEBUG
            if (newTabList[nNewHashVal])
                set->nCollisions++;
#endif
            TIFFList *psNext = cur->psNext;
            cur->psNext = newTabList[nNewHashVal];
            newTabList[nNewHashVal] = cur;
            cur = psNext;
        }
    }
    free(set->tabList);
    set->tabList = newTabList;
    set->nAllocatedSize = nNewAllocatedSize;
    set->bRehash = false;
    return true;
}